

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoShuffle.c
# Opt level: O3

void Extra_ShuffleTest(reo_man *pReo,DdManager *dd,DdNode *Func)

{
  uint uVar1;
  int iVar2;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  ulong uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar8 [16];
  timespec ts;
  int pOrder [1000];
  int pOrderInv [1000];
  timespec tStack_1f88;
  int local_1f78 [1000];
  int local_fd8 [1002];
  long lVar7;
  
  if (999 < dd->size) {
    __assert_fail("dd->size < 1000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/reo/reoShuffle.c"
                  ,0xa7,"void Extra_ShuffleTest(reo_man *, DdManager *, DdNode *)");
  }
  srand(0x12341234);
  uVar1 = Cudd_SupportSize(dd,Func);
  if (1 < (int)uVar1) {
    lVar7 = (ulong)uVar1 - 1;
    auVar5._8_4_ = (int)lVar7;
    auVar5._0_8_ = lVar7;
    auVar5._12_4_ = (int)((ulong)lVar7 >> 0x20);
    uVar3 = 0;
    auVar5 = auVar5 ^ _DAT_007ee2e0;
    auVar6 = _DAT_007ee2d0;
    do {
      auVar8 = auVar6 ^ _DAT_007ee2e0;
      if ((bool)(~(auVar8._4_4_ == auVar5._4_4_ && auVar5._0_4_ < auVar8._0_4_ ||
                  auVar5._4_4_ < auVar8._4_4_) & 1)) {
        local_1f78[uVar3] = (int)uVar3;
      }
      if ((auVar8._12_4_ != auVar5._12_4_ || auVar8._8_4_ <= auVar5._8_4_) &&
          auVar8._12_4_ <= auVar5._12_4_) {
        local_1f78[uVar3 + 1] = (int)uVar3 + 1;
      }
      uVar3 = uVar3 + 2;
      lVar7 = auVar6._8_8_;
      auVar6._0_8_ = auVar6._0_8_ + 2;
      auVar6._8_8_ = lVar7 + 2;
    } while ((uVar1 + 1 & 0xfffffffe) != uVar3);
    iVar4 = 0x78;
    do {
      iVar2 = rand();
      iVar2 = iVar2 % (int)(uVar1 - 1);
      *(ulong *)(local_1f78 + iVar2) =
           CONCAT44((int)*(undefined8 *)(local_1f78 + iVar2),
                    (int)((ulong)*(undefined8 *)(local_1f78 + iVar2) >> 0x20));
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    uVar3 = 0;
    do {
      local_fd8[local_1f78[uVar3]] = (int)uVar3;
      uVar3 = uVar3 + 1;
    } while (uVar1 != uVar3);
    n = Extra_bddRemapUp(dd,Func);
    Cudd_Ref(n);
    clock_gettime(3,&tStack_1f88);
    n_00 = reoShuffle(pReo,dd,n,local_1f78,local_fd8);
    Cudd_Ref(n_00);
    clock_gettime(3,&tStack_1f88);
    n_01 = Cudd_bddPermute(dd,n,local_fd8);
    Cudd_Ref(n_01);
    if (n_01 != n_00) {
      puts("REO: Internal verification has failed!");
      fflush(_stdout);
    }
    Cudd_RecursiveDeref(dd,n_01);
    Cudd_RecursiveDeref(dd,n_00);
    Cudd_RecursiveDeref(dd,n);
  }
  return;
}

Assistant:

void Extra_ShuffleTest( reo_man * pReo, DdManager * dd, DdNode * Func )
{
//    extern int runtime1, runtime2;

	DdNode * Temp, * bRemap;
    int nSuppSize, OffSet, Num, i;
    abctime clk;
	int pOrder[1000], pOrderInv[1000];
    assert( dd->size < 1000 );

    srand( 0x12341234 );
    nSuppSize = Cudd_SupportSize( dd, Func );
    if ( nSuppSize < 2 )
        return;

    for ( i = 0; i < nSuppSize; i++ )
        pOrder[i] = i;
    for ( i = 0; i < 120; i++ )
    {
        OffSet = rand() % (nSuppSize - 1);
        Num = pOrder[OffSet];
        pOrder[OffSet] = pOrder[OffSet+1];
        pOrder[OffSet+1] = Num;
    }
    for ( i = 0; i < nSuppSize; i++ )
        pOrderInv[pOrder[i]] = i;

/*
    printf( "Permutation: " );
    for ( i = 0; i < nSuppSize; i++ )
        printf( "%d ", pOrder[i] );
    printf( "\n" );
    printf( "Inverse permutation: " );
    for ( i = 0; i < nSuppSize; i++ )
        printf( "%d ", pOrderInv[i] );
    printf( "\n" );
*/

    // create permutation
//    Extra_ReorderSetVerification( pReo, 1 );
    bRemap = Extra_bddRemapUp( dd, Func );  Cudd_Ref( bRemap );

clk = Abc_Clock();
	Temp  = reoShuffle( pReo, dd, bRemap, pOrder, pOrderInv );  Cudd_Ref( Temp );
//runtime1 += Abc_Clock() - clk;

//printf( "Initial = %d. Final = %d.\n", Cudd_DagSize(bRemap), Cudd_DagSize(Temp)  );

	{
		DdNode * bFuncPerm;
clk = Abc_Clock();
		bFuncPerm = Cudd_bddPermute( dd, bRemap, pOrderInv );  Cudd_Ref( bFuncPerm );
//runtime2 += Abc_Clock() - clk;
		if ( bFuncPerm != Temp )
		{
			printf( "REO: Internal verification has failed!\n" );
			fflush( stdout );
		}
		Cudd_RecursiveDeref( dd, bFuncPerm );
	}

	Cudd_RecursiveDeref( dd, Temp );
	Cudd_RecursiveDeref( dd, bRemap );
}